

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

uv_handle_type uv_pipe_pending_type(uv_pipe_t *handle)

{
  uv_pipe_t *handle_local;
  
  if (handle->ipc == 0) {
    handle_local._4_4_ = UV_UNKNOWN_HANDLE;
  }
  else if (handle->accepted_fd == -1) {
    handle_local._4_4_ = UV_UNKNOWN_HANDLE;
  }
  else {
    handle_local._4_4_ = uv_guess_handle(handle->accepted_fd);
  }
  return handle_local._4_4_;
}

Assistant:

uv_handle_type uv_pipe_pending_type(uv_pipe_t* handle) {
  if (!handle->ipc)
    return UV_UNKNOWN_HANDLE;

  if (handle->accepted_fd == -1)
    return UV_UNKNOWN_HANDLE;
  else
    return uv_guess_handle(handle->accepted_fd);
}